

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

Vector3 __thiscall xatlas::internal::Mesh::computeFaceCenter(Mesh *this,uint32_t face)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint uVar8;
  ulong uVar9;
  char *__function;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector3 VVar14;
  
  uVar8 = face * 3;
  uVar4 = (this->m_indices).m_base.size;
  if (uVar8 < uVar4) {
    puVar6 = (this->m_indices).m_base.buffer;
    uVar9 = (ulong)*(uint *)(puVar6 + (ulong)uVar8 * 4);
    uVar5 = (this->m_positions).m_base.size;
    if (*(uint *)(puVar6 + (ulong)uVar8 * 4) < uVar5) {
      if (uVar4 <= uVar8 + 1) goto LAB_001b2a2f;
      if (*(uint *)(puVar6 + (ulong)(uVar8 + 1) * 4) < uVar5) {
        if (uVar4 <= uVar8 + 2) goto LAB_001b2a2f;
        if (*(uint *)(puVar6 + (ulong)(uVar8 + 2) * 4) < uVar5) {
          puVar7 = (this->m_positions).m_base.buffer;
          pfVar1 = (float *)(puVar7 + (ulong)*(uint *)(puVar6 + (ulong)(uVar8 + 1) * 4) * 0xc);
          pfVar2 = (float *)(puVar7 + (ulong)*(uint *)(puVar6 + (ulong)(uVar8 + 2) * 4) * 0xc);
          fVar10 = (pfVar1[2] - *(float *)(puVar7 + uVar9 * 0xc + 8)) *
                   (pfVar1[2] - *(float *)(puVar7 + uVar9 * 0xc + 8)) +
                   (*pfVar1 - *(float *)(puVar7 + uVar9 * 0xc)) *
                   (*pfVar1 - *(float *)(puVar7 + uVar9 * 0xc)) +
                   (pfVar1[1] - *(float *)(puVar7 + uVar9 * 0xc + 4)) *
                   (pfVar1[1] - *(float *)(puVar7 + uVar9 * 0xc + 4));
          if (fVar10 < 0.0) {
            fVar10 = sqrtf(fVar10);
          }
          else {
            fVar10 = SQRT(fVar10);
          }
          pfVar3 = (float *)(puVar7 + uVar9 * 0xc);
          fVar11 = (pfVar2[2] - pfVar1[2]) * (pfVar2[2] - pfVar1[2]) +
                   (*pfVar2 - *pfVar1) * (*pfVar2 - *pfVar1) +
                   (pfVar2[1] - pfVar1[1]) * (pfVar2[1] - pfVar1[1]);
          if (fVar11 < 0.0) {
            fVar11 = sqrtf(fVar11);
          }
          else {
            fVar11 = SQRT(fVar11);
          }
          fVar12 = (pfVar3[2] - pfVar2[2]) * (pfVar3[2] - pfVar2[2]) +
                   (*pfVar3 - *pfVar2) * (*pfVar3 - *pfVar2) +
                   (pfVar3[1] - pfVar2[1]) * (pfVar3[1] - pfVar2[1]);
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          fVar13 = 1.0 / (fVar10 + fVar11 + fVar12);
          VVar14.z = (pfVar3[2] + pfVar2[2]) * fVar12 * fVar13 +
                     (pfVar1[2] + pfVar2[2]) * fVar11 * fVar13 +
                     (pfVar3[2] + pfVar1[2]) * fVar10 * fVar13;
          VVar14.x = (*pfVar3 + *pfVar2) * fVar12 * fVar13 +
                     (*pfVar1 + *pfVar2) * fVar11 * fVar13 + (*pfVar3 + *pfVar1) * fVar10 * fVar13;
          VVar14.y = (pfVar3[1] + pfVar2[1]) * fVar12 * fVar13 +
                     (pfVar1[1] + pfVar2[1]) * fVar11 * fVar13 +
                     (pfVar3[1] + pfVar1[1]) * fVar10 * fVar13;
          return VVar14;
        }
      }
    }
    __function = 
    "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
    ;
  }
  else {
LAB_001b2a2f:
    __function = 
    "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]";
  }
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

Vector3 computeFaceCenter(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const float l0 = length(p1 - p0);
		const float l1 = length(p2 - p1);
		const float l2 = length(p0 - p2);
		const Vector3 m0 = (p0 + p1) * l0 / (l0 + l1 + l2);
		const Vector3 m1 = (p1 + p2) * l1 / (l0 + l1 + l2);
		const Vector3 m2 = (p2 + p0) * l2 / (l0 + l1 + l2);
		return m0 + m1 + m2;
	}